

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

CPChar cp_get_bs(CPState *cp)

{
  byte bVar1;
  byte *pbVar2;
  uint uVar3;
  uint uVar4;
  uint *in_RDI;
  CPChar c;
  CPChar c2;
  bool local_41;
  uint local_2c;
  uint local_1c;
  
  uVar3 = (uint)**(byte **)(in_RDI + 8);
  local_41 = uVar3 == 10 || uVar3 == 0xd;
  if (local_41) {
    *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + 1;
    bVar1 = **(byte **)(in_RDI + 8);
    uVar4 = (uint)bVar1;
    if ((uVar4 == 10 || uVar4 == 0xd) && (uVar4 != uVar3)) {
      *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + 1;
    }
    in_RDI[0x16] = in_RDI[0x16] + 1;
    pbVar2 = *(byte **)(in_RDI + 8);
    *(byte **)(in_RDI + 8) = pbVar2 + 1;
    *in_RDI = (uint)*pbVar2;
    if (*in_RDI == 0x5c) {
      local_1c = cp_get_bs((CPState *)(ulong)CONCAT14(bVar1,uVar3));
    }
    else {
      local_1c = *in_RDI;
    }
    local_2c = local_1c;
  }
  else {
    local_2c = *in_RDI;
  }
  return local_2c;
}

Assistant:

static LJ_NOINLINE CPChar cp_get_bs(CPState *cp)
{
  CPChar c2, c = cp_rawpeek(cp);
  if (!cp_iseol(c)) return cp->c;
  cp->p++;
  c2 = cp_rawpeek(cp);
  if (cp_iseol(c2) && c2 != c) cp->p++;
  cp->linenumber++;
  return cp_get(cp);
}